

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GeomCamera *camera,uint32_t indent,
          bool closing_brace)

{
  optional<tinyusdz::Interpolation> oVar1;
  undefined8 uVar2;
  bool bVar3;
  ostream *poVar4;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar5;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  undefined3 in_register_00000081;
  uint32_t uVar6;
  uint indent_00;
  stringstream ss;
  string local_210;
  undefined1 local_1f0 [56];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar6 = CONCAT31(in_register_00000081,closing_brace);
  local_1f0._36_4_ = indent;
  local_1f0._48_8_ = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)camera & 0xffffffff),n);
  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  to_string_abi_cxx11_((string *)local_1f0,(tinyusdz *)(ulong)*(uint *)(this + 0xa98),s);
  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)local_1f0._0_8_,local_1f0._8_8_);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," Camera \"",9);
  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)(this + 0xa78),*(long *)(this + 0xa80));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
  oVar1 = (optional<tinyusdz::Interpolation>)((long)local_1f0 + 0x10);
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  bVar3 = PrimMetas::authored((PrimMetas *)(this + 0x1a10));
  uVar5 = n_00;
  if (bVar3) {
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)camera & 0xffffffff),n_00);
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    print_prim_metas_abi_cxx11_
              (&local_210,this + 0x1a10,(PrimMeta *)(ulong)((int)camera + 1),indent);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    uVar5 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      uVar5 = extraout_EDX_00;
    }
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)camera & 0xffffffff),uVar5);
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
    uVar5 = extraout_EDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      uVar5 = extraout_EDX_02;
    }
  }
  pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)camera & 0xffffffff),uVar5);
  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"clippingRange","");
  indent_00 = (int)camera + 1;
  local_1f0._40_8_ = (pprint *)((ulong)camera & 0xffffffff);
  print_typed_attr<std::array<float,2ul>>
            (&local_210,this + 0x20e0,
             (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)local_1f0
             ,(string *)(ulong)indent_00,uVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"clippingPlanes","");
  print_typed_attr<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
            (&local_210,this + 0x1e68,
             (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
              *)local_1f0,(string *)(ulong)indent_00,uVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"focalLength","");
  print_typed_attr<float>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x2600),
             (string *)local_1f0,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"horizontalAperture","");
  print_typed_attr<float>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x2b10),
             (string *)local_1f0,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f0,"horizontalApertureOffset","");
  print_typed_attr<float>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x2d98),
             (string *)local_1f0,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"verticalAperture","");
  print_typed_attr<float>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x3020),
             (string *)local_1f0,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"verticalApertureOffset","")
  ;
  print_typed_attr<float>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x32a8),
             (string *)local_1f0,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"projection","");
  print_typed_token_attr<tinyusdz::GeomCamera::Projection>
            (&local_210,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_> *)
             (this + 0x37b8),(string *)local_1f0,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"stereoRole","");
  print_typed_token_attr<tinyusdz::GeomCamera::StereoRole>
            (&local_210,
             (TypedAttributeWithFallback<tinyusdz::GeomCamera::StereoRole> *)(this + 0x3a40),
             (string *)local_1f0,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"shutter:open","");
  print_typed_attr<double>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *)(this + 0x3f10)
             ,(string *)local_1f0,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"shutter:close","");
  print_typed_attr<double>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *)(this + 0x3c78)
             ,(string *)local_1f0,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  uVar2 = local_1f0._40_8_;
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  print_gprim_predefined<tinyusdz::GeomCamera>(&local_210,(GeomCamera *)this,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  print_props(&local_210,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x1970),indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  uVar6 = extraout_EDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    uVar6 = extraout_EDX_04;
  }
  if (local_1f0[0x24] != '\0') {
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)(uVar2 & 0xffffffff),uVar6);
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
  }
  uVar2 = local_1f0._48_8_;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return (string *)uVar2;
}

Assistant:

std::string to_string(const GeomCamera &camera, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(camera.spec) << " Camera \""
     << camera.name << "\"\n";
  if (camera.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(camera.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  ss << print_typed_attr(camera.clippingRange, "clippingRange", indent + 1);
  ss << print_typed_attr(camera.clippingPlanes, "clippingPlanes", indent + 1);
  ss << print_typed_attr(camera.focalLength, "focalLength", indent + 1);
  ss << print_typed_attr(camera.horizontalAperture, "horizontalAperture",
                         indent + 1);
  ss << print_typed_attr(camera.horizontalApertureOffset,
                         "horizontalApertureOffset", indent + 1);
  ss << print_typed_attr(camera.verticalAperture, "verticalAperture",
                         indent + 1);
  ss << print_typed_attr(camera.verticalApertureOffset,
                         "verticalApertureOffset", indent + 1);

  ss << print_typed_token_attr(camera.projection, "projection", indent + 1);
  ss << print_typed_token_attr(camera.stereoRole, "stereoRole", indent + 1);

  ss << print_typed_attr(camera.shutterOpen, "shutter:open", indent + 1);
  ss << print_typed_attr(camera.shutterClose, "shutter:close", indent + 1);

  ss << print_gprim_predefined(camera, indent + 1);

  ss << print_props(camera.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}